

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O1

int lj_cf_loadfile(lua_State *L)

{
  int iVar1;
  GCstr *pGVar2;
  GCstr *pGVar3;
  GCstr *filename;
  
  if ((L->base < L->top) && ((L->base->field_2).it != 0xffffffff)) {
    pGVar2 = lj_lib_checkstr(L,1);
  }
  else {
    pGVar2 = (GCstr *)0x0;
  }
  if ((L->base + 1 < L->top) && (*(int *)((long)L->base + 0xc) != -1)) {
    pGVar3 = lj_lib_checkstr(L,2);
  }
  else {
    pGVar3 = (GCstr *)0x0;
  }
  lua_settop(L,3);
  filename = pGVar2 + 1;
  if (pGVar2 == (GCstr *)0x0) {
    filename = (GCstr *)0x0;
  }
  pGVar2 = pGVar3 + 1;
  if (pGVar3 == (GCstr *)0x0) {
    pGVar2 = (GCstr *)0x0;
  }
  iVar1 = luaL_loadfilex(L,(char *)filename,(char *)pGVar2);
  iVar1 = load_aux(L,iVar1,3);
  return iVar1;
}

Assistant:

LJLIB_CF(loadfile)
{
  GCstr *fname = lj_lib_optstr(L, 1);
  GCstr *mode = lj_lib_optstr(L, 2);
  int status;
  lua_settop(L, 3);  /* Ensure env arg exists. */
  status = luaL_loadfilex(L, fname ? strdata(fname) : NULL,
			  mode ? strdata(mode) : NULL);
  return load_aux(L, status, 3);
}